

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void * arena_ralloc(tsdn_t *tsdn,arena_t *arena,void *ptr,size_t oldsize,size_t size,
                   size_t alignment,_Bool zero,tcache_t *tcache,hook_ralloc_args_t *hook_args)

{
  byte zero_00;
  _Bool _Var1;
  uint uVar2;
  size_t x_00;
  cache_bin_t *tbin;
  cache_bin_info_t *pcVar3;
  ulong uVar4;
  ulong uVar5;
  rtree_t *in_RCX;
  tsdn_t *in_RDX;
  tsdn_t *in_RSI;
  tsd_t *in_RDI;
  rtree_ctx_t *in_R8;
  size_t in_R9;
  byte in_stack_00000008;
  tcache_t *in_stack_00000010;
  size_t copysize;
  void *ret;
  size_t newsize;
  size_t usize;
  tsd_t *tsd;
  uint8_t state;
  size_t ret_1;
  size_t ret_3;
  szind_t ret_2;
  size_t usize_1;
  size_t delta_mask;
  size_t delta;
  size_t lg_delta;
  size_t x;
  size_t lg_ceil;
  size_t lg_tmin;
  extent_t *extent;
  _Bool slab;
  szind_t szind;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *elm;
  cache_bin_info_t *bin_info_1;
  cache_bin_t *bin_1;
  size_t ret_6;
  szind_t ret_4;
  uint8_t state_1;
  rtree_leaf_elm_t *elm_1;
  uintptr_t subkey_2;
  rtree_leaf_elm_t *leaf_2;
  uint i;
  uintptr_t subkey_1;
  rtree_leaf_elm_t *leaf_1;
  uintptr_t subkey;
  rtree_leaf_elm_t *leaf;
  uintptr_t leafkey;
  size_t slot;
  uint maskbits;
  uint cumbits;
  uint ptrbits;
  uintptr_t mask;
  uint maskbits_1;
  uint cumbits_1;
  uint ptrbits_1;
  uintptr_t mask_1;
  uint maskbits_2;
  uint shiftbits;
  uint cumbits_2;
  uint ptrbits_2;
  uintptr_t mask_2;
  uint maskbits_3;
  uint shiftbits_1;
  uint cumbits_3;
  uint ptrbits_3;
  uintptr_t mask_3;
  uint maskbits_4;
  uint shiftbits_2;
  uint cumbits_4;
  uint ptrbits_4;
  uintptr_t bits;
  void *result;
  _Bool ret_5;
  cache_bin_info_t *bin_info;
  cache_bin_t *bin;
  bin_info_t *in_stack_fffffffffffff908;
  extent_t *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  int in_stack_fffffffffffff91c;
  tsd_t *in_stack_fffffffffffff920;
  rtree_t *prVar6;
  undefined7 in_stack_fffffffffffff938;
  undefined1 uVar7;
  tsdn_t *in_stack_fffffffffffff940;
  rtree_t *local_6b8;
  uintptr_t *in_stack_fffffffffffff960;
  undefined6 in_stack_fffffffffffff970;
  undefined1 in_stack_fffffffffffff976;
  rtree_t *rtree;
  tsdn_t *tsdn_00;
  undefined8 in_stack_fffffffffffff9a8;
  uintptr_t *args_raw;
  undefined1 zero_01;
  rtree_ctx_t *prVar8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  byte bVar9;
  tsdn_t *in_stack_fffffffffffff9c8;
  witness_tsd_t *local_600;
  rtree_ctx_t *local_568;
  rtree_t *local_560;
  uint local_50c;
  rtree_ctx_t local_4f0;
  tsdn_t *local_370;
  tsd_t *local_368;
  rtree_ctx_t *local_360;
  rtree_ctx_t *local_350;
  rtree_leaf_elm_t *local_330;
  byte local_321;
  tsdn_t *local_320;
  rtree_ctx_t *local_318;
  rtree_t *local_310;
  tsd_t *local_308;
  ulong local_300;
  cache_bin_info_t *local_2f8;
  cache_bin_t *local_2f0;
  byte local_2e5;
  uint local_2e4;
  tsdn_t *local_2e0;
  tcache_t *local_2d8;
  tsd_t *local_2d0;
  uint local_2c4;
  size_t local_2c0;
  uint local_2b8;
  uint local_2b4;
  uint8_t local_2a1;
  rtree_leaf_elm_t *local_288;
  byte local_279;
  tsdn_t *local_278;
  rtree_ctx_t *local_270;
  rtree_t *local_268;
  tsd_t *local_260;
  rtree_leaf_elm_t *local_258;
  ulong local_250;
  rtree_leaf_elm_t *local_248;
  uint local_23c;
  ulong local_238;
  rtree_leaf_elm_t *local_230;
  ulong local_228;
  rtree_leaf_elm_t *local_220;
  uintptr_t local_218;
  ulong local_210;
  undefined1 local_202;
  undefined1 local_201;
  tsdn_t *local_200;
  rtree_ctx_t *local_1f8;
  rtree_t *local_1f0;
  tsd_t *local_1e8;
  rtree_leaf_elm_t *local_1e0;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  tsdn_t *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  tsdn_t *local_1a8;
  undefined8 local_1a0;
  uint local_194;
  undefined4 local_190;
  uint local_18c;
  undefined4 local_188;
  undefined4 local_184;
  tsdn_t *local_180;
  undefined8 local_178;
  uint local_16c;
  undefined4 local_168;
  uint local_164;
  undefined4 local_160;
  undefined4 local_15c;
  tsdn_t *local_158;
  undefined8 local_150;
  uint local_144;
  undefined4 local_140;
  uint local_13c;
  undefined4 local_138;
  undefined4 local_134;
  tsdn_t *local_130;
  tcache_t *local_128;
  tsd_t *local_120;
  uint local_114;
  tcache_t *local_110;
  void *local_108;
  byte local_f9;
  rtree_leaf_elm_t *local_f8;
  rtree_t *local_f0;
  tsd_t *local_e8;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  void *local_c0;
  int local_a4;
  
  zero_01 = (undefined1)((ulong)in_stack_fffffffffffff9a8 >> 0x38);
  zero_00 = in_stack_00000008 & 1;
  local_a4 = in_stack_fffffffffffff91c;
  prVar8 = in_R8;
  if (in_R8 < (rtree_ctx_t *)0x1001) {
    local_6b8 = (rtree_t *)
                sz_index2size_tab
                [sz_size2index_tab[(ulong)((long)&in_R8->cache[0].leafkey + 7U) >> 3]];
  }
  else if (in_R8 < (rtree_ctx_t *)0x7000000000000001) {
    local_568 = in_R8;
    if (in_R8 == (rtree_ctx_t *)0x0) {
      local_568 = (rtree_ctx_t *)0x1;
    }
    if (local_568 < (rtree_ctx_t *)0x9) {
      x_00 = pow2_ceil_zu(0x118b37);
      uVar2 = lg_floor(x_00);
      if (uVar2 < 3) {
        bVar9 = 3;
      }
      else {
        bVar9 = (byte)uVar2 & 0x3f;
      }
      local_6b8 = (rtree_t *)(1L << bVar9);
      local_a4 = in_stack_fffffffffffff91c;
    }
    else {
      uVar2 = lg_floor((long)local_568 * 2 - 1);
      if ((ulong)uVar2 < 7) {
        in_stack_fffffffffffff940 = (tsdn_t *)0x4;
      }
      else {
        in_stack_fffffffffffff940 = (tsdn_t *)((ulong)uVar2 - 3);
      }
      uVar4 = (1L << ((byte)in_stack_fffffffffffff940 & 0x3f)) - 1;
      local_6b8 = (rtree_t *)((long)local_568->cache + uVar4 & (uVar4 ^ 0xffffffffffffffff));
      local_a4 = in_stack_fffffffffffff91c;
    }
  }
  else {
    local_560 = (rtree_t *)0x0;
    local_6b8 = local_560;
  }
  uVar7 = local_6b8 == (rtree_t *)0x0 || (rtree_ctx_t *)0x7000000000000000 < in_R8;
  if (local_6b8 == (rtree_t *)0x0 || (rtree_ctx_t *)0x7000000000000000 < in_R8) {
    args_raw = (uintptr_t *)0x0;
  }
  else {
    prVar6 = local_6b8;
    if (local_6b8 < (rtree_t *)0x3801) {
      in_stack_fffffffffffff908 = (bin_info_t *)&stack0xfffffffffffff960;
      _Var1 = arena_ralloc_no_move
                        (in_RSI,in_RDX,(size_t)in_RCX,(size_t)in_R8,in_R9,(_Bool)zero_00,
                         (size_t *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
      if (!_Var1) {
        hook_invoke_expand((hook_expand_t)((ulong)in_RCX >> 0x20),in_R8,in_R9,
                           CONCAT17(zero_00,CONCAT16(in_stack_fffffffffffff976,
                                                     in_stack_fffffffffffff970)),
                           (uintptr_t)local_6b8,in_stack_fffffffffffff960);
        return in_RDX;
      }
    }
    if ((in_RCX < (rtree_t *)0x4000) || (local_6b8 < (rtree_t *)0x4000)) {
      args_raw = (uintptr_t *)
                 arena_ralloc_move_helper
                           (in_stack_fffffffffffff9c8,
                            (arena_t *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0)
                            ,(size_t)prVar6,(size_t)prVar8,(_Bool)zero_01,(tcache_t *)in_RDI);
      if (args_raw == (uintptr_t *)0x0) {
        args_raw = (uintptr_t *)0x0;
      }
      else {
        hook_invoke_alloc((hook_alloc_t)(in_R9 >> 0x20),
                          (void *)CONCAT17(zero_00,CONCAT16(in_stack_fffffffffffff976,
                                                            in_stack_fffffffffffff970)),
                          (uintptr_t)local_6b8,in_stack_fffffffffffff960);
        hook_invoke_dalloc((hook_dalloc_t)((ulong)local_6b8 >> 0x20),in_stack_fffffffffffff960,
                           args_raw);
        prVar6 = in_RCX;
        if (local_6b8 < in_RCX) {
          prVar6 = local_6b8;
        }
        memcpy(args_raw,in_RDX,(size_t)prVar6);
        bVar9 = 1;
        if (in_RDI == (tsd_t *)0x0) {
          local_600 = (witness_tsd_t *)0x0;
        }
        else {
          local_600 = &in_RDI->cant_access_tsd_items_directly_use_a_getter_or_setter_witness_tsd;
        }
        rtree = in_RCX;
        tsdn_00 = in_RDX;
        witness_assert_depth_to_rank((witness_tsdn_t *)local_600,0xc,0);
        bVar9 = bVar9 & 1;
        if (in_stack_00000010 == (tcache_t *)0x0) {
          arena_sdalloc_no_tcache
                    (in_stack_fffffffffffff940,(void *)CONCAT17(uVar7,in_stack_fffffffffffff938),
                     (size_t)prVar6);
        }
        else {
          if (in_RCX < (rtree_t *)0x1001) {
            local_50c = (uint)sz_size2index_tab
                              [(ulong)((long)&(in_RCX->init_lock).field_0 + 7U) >> 3];
            local_2b4 = local_50c;
          }
          else {
            local_50c = sz_size2index_compute(CONCAT17(uVar7,in_stack_fffffffffffff938));
          }
          if (local_50c < 0x24) {
            if ((bVar9 != 0) && ((opt_junk_free & 1U) != 0)) {
              arena_dalloc_junk_small_impl(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
            }
            tbin = in_stack_00000010->bins_small + local_50c;
            pcVar3 = tcache_bin_info + local_50c;
            if (tbin->ncached == pcVar3->ncached_max) {
              tcache_bin_flush_small
                        (in_RDI,in_stack_00000010,tbin,local_50c,pcVar3->ncached_max >> 1);
              if (tbin->ncached != pcVar3->ncached_max) {
                tbin->ncached = tbin->ncached + 1;
                tbin->avail[-(long)tbin->ncached] = in_RDX;
              }
            }
            else {
              tbin->ncached = tbin->ncached + 1;
              tbin->avail[-(long)tbin->ncached] = in_RDX;
            }
            _Var1 = ticker_tick((ticker_t *)0x1193fd);
            if (_Var1) {
              tcache_event_hard(in_stack_fffffffffffff920,
                                (tcache_t *)CONCAT44(local_a4,in_stack_fffffffffffff918));
            }
          }
          else if (local_50c < nhbins) {
            local_2d8 = in_stack_00000010;
            local_2e4 = local_50c;
            local_2e5 = bVar9;
            local_2e0 = in_RDX;
            local_2d0 = in_RDI;
            if ((bVar9 != 0) && ((opt_junk_free & 1U) != 0)) {
              local_2c4 = local_50c;
              local_2b8 = local_50c;
              local_2c0 = sz_index2size_tab[local_50c];
              large_dalloc_junk_impl(in_stack_fffffffffffff910,(size_t)in_stack_fffffffffffff908);
            }
            local_110 = local_2d8;
            local_114 = local_2e4;
            local_2f0 = local_2d8->bins_small + (ulong)local_2e4 + 5;
            local_2f8 = tcache_bin_info + local_2e4;
            if (local_2f0->ncached == local_2f8->ncached_max) {
              tcache_bin_flush_large
                        (local_2d0,local_2f0,local_2e4,local_2f8->ncached_max >> 1,local_2d8);
            }
            local_2f0->ncached = local_2f0->ncached + 1;
            local_2f0->avail[-(long)local_2f0->ncached] = local_2e0;
            local_120 = local_2d0;
            local_128 = local_2d8;
            _Var1 = ticker_tick((ticker_t *)0x11961d);
            if (_Var1) {
              tcache_event_hard(in_stack_fffffffffffff920,
                                (tcache_t *)CONCAT44(local_a4,in_stack_fffffffffffff918));
            }
          }
          else {
            local_360 = &local_4f0;
            local_370 = in_RDX;
            local_368 = in_RDI;
            if (in_RDI == (tsd_t *)0x0) {
              rtree_ctx_data_init(local_360);
              local_350 = local_360;
            }
            else {
              local_2a1 = (in_RDI->state).repr;
              local_350 = &in_RDI->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
            }
            local_308 = local_368;
            local_310 = &extents_rtree;
            local_318 = local_350;
            local_320 = local_370;
            local_321 = 1;
            local_260 = local_368;
            local_268 = &extents_rtree;
            local_270 = local_350;
            local_278 = local_370;
            local_279 = 1;
            local_1e8 = local_368;
            local_1f0 = &extents_rtree;
            local_1f8 = local_350;
            local_200 = local_370;
            local_201 = 1;
            local_202 = 0;
            local_1c8 = local_370;
            local_1cc = 0x40;
            local_1d0 = 0x22;
            local_1d4 = 0x1e;
            uVar4 = (ulong)local_370 >> 0x1e & 0xf;
            local_1a8 = local_370;
            local_1ac = 0x40;
            local_1b0 = 0x22;
            local_1b4 = 0x1e;
            local_1c0 = 0xffffffffc0000000;
            uVar5 = (ulong)local_370 & 0xffffffffc0000000;
            local_218 = uVar5;
            local_210 = uVar4;
            if (local_350->cache[uVar4].leafkey == uVar5) {
              local_220 = local_350->cache[uVar4].leaf;
              local_180 = local_370;
              local_184 = 1;
              local_188 = 0x40;
              local_18c = 0x34;
              local_190 = 0xc;
              local_194 = 0x12;
              local_1a0 = 0x3ffff;
              local_228 = (ulong)local_370 >> 0xc & 0x3ffff;
              local_1e0 = local_220 + local_228;
            }
            else if (local_350->l2_cache[0].leafkey == uVar5) {
              local_230 = local_350->l2_cache[0].leaf;
              local_350->l2_cache[0].leafkey = local_350->cache[uVar4].leafkey;
              local_1f8->l2_cache[0].leaf = local_1f8->cache[local_210].leaf;
              local_1f8->cache[local_210].leafkey = local_218;
              local_1f8->cache[local_210].leaf = local_230;
              local_158 = local_200;
              local_15c = 1;
              local_160 = 0x40;
              local_164 = 0x34;
              local_168 = 0xc;
              local_16c = 0x12;
              local_178 = 0x3ffff;
              local_238 = (ulong)local_200 >> 0xc & 0x3ffff;
              local_1e0 = local_230 + local_238;
            }
            else {
              for (local_23c = 1; local_23c < 8; local_23c = local_23c + 1) {
                if (local_350->l2_cache[local_23c].leafkey == uVar5) {
                  local_248 = local_350->l2_cache[local_23c].leaf;
                  if (local_23c == 0) {
                    local_350->l2_cache[0].leafkey = local_350->cache[uVar4].leafkey;
                    local_1f8->l2_cache[0].leaf = local_1f8->cache[local_210].leaf;
                  }
                  else {
                    local_350->l2_cache[local_23c].leafkey =
                         local_350->l2_cache[local_23c - 1].leafkey;
                    local_350->l2_cache[local_23c].leaf = local_350->l2_cache[local_23c - 1].leaf;
                    local_350->l2_cache[local_23c - 1].leafkey = local_350->cache[uVar4].leafkey;
                    local_350->l2_cache[local_23c - 1].leaf = local_350->cache[uVar4].leaf;
                  }
                  local_1f8->cache[local_210].leafkey = local_218;
                  local_1f8->cache[local_210].leaf = local_248;
                  local_130 = local_200;
                  local_134 = 1;
                  local_138 = 0x40;
                  local_13c = 0x34;
                  local_140 = 0xc;
                  local_144 = 0x12;
                  local_150 = 0x3ffff;
                  local_250 = (ulong)local_200 >> 0xc & 0x3ffff;
                  local_1e0 = local_248 + local_250;
                  goto LAB_00119f1a;
                }
              }
              local_1e0 = rtree_leaf_elm_lookup_hard
                                    (tsdn_00,rtree,in_R8,in_R9,(_Bool)zero_00,
                                     (_Bool)in_stack_fffffffffffff976);
            }
LAB_00119f1a:
            local_288 = local_1e0;
            if (((local_279 & 1) == 0) && (local_1e0 == (rtree_leaf_elm_t *)0x0)) {
              local_258 = (rtree_leaf_elm_t *)0x0;
            }
            else {
              local_258 = local_1e0;
            }
            local_330 = local_258;
            if (((local_321 & 1) == 0) && (local_258 == (rtree_leaf_elm_t *)0x0)) {
              local_300 = 0;
            }
            else {
              local_e8 = local_308;
              local_f0 = local_310;
              local_f8 = local_258;
              local_f9 = local_321 & 1;
              switch(~local_f9 & 1) {
              case 0:
                local_a4 = 0;
                break;
              case 1:
                local_a4 = 2;
              }
              if (local_a4 - 1U < 2) {
                local_c0 = (local_258->le_bits).repr;
              }
              else if (local_a4 == 5) {
                local_c0 = (local_258->le_bits).repr;
              }
              else {
                local_c0 = (local_258->le_bits).repr;
              }
              local_108 = local_c0;
              local_300 = ((long)local_c0 << 0x10) >> 0x10 & 0xfffffffffffffffe;
            }
            large_dalloc((tsdn_t *)CONCAT44(local_a4,in_stack_fffffffffffff918),
                         in_stack_fffffffffffff910);
          }
        }
      }
    }
    else {
      args_raw = (uintptr_t *)
                 large_ralloc(in_RDX,(arena_t *)in_RCX,in_R8,in_R9,
                              CONCAT17(zero_00,CONCAT16(in_stack_fffffffffffff976,
                                                        in_stack_fffffffffffff970)),
                              SUB81((ulong)local_6b8 >> 0x38,0),
                              (tcache_t *)rtree_ctx_fallback.l2_cache[5].leaf,
                              (hook_ralloc_args_t *)rtree_ctx_fallback.l2_cache[6].leafkey);
    }
  }
  return args_raw;
}

Assistant:

void *
arena_ralloc(tsdn_t *tsdn, arena_t *arena, void *ptr, size_t oldsize,
    size_t size, size_t alignment, bool zero, tcache_t *tcache,
    hook_ralloc_args_t *hook_args) {
	size_t usize = sz_s2u(size);
	if (unlikely(usize == 0 || size > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(usize <= SC_SMALL_MAXCLASS)) {
		/* Try to avoid moving the allocation. */
		UNUSED size_t newsize;
		if (!arena_ralloc_no_move(tsdn, ptr, oldsize, usize, 0, zero,
		    &newsize)) {
			hook_invoke_expand(hook_args->is_realloc
			    ? hook_expand_realloc : hook_expand_rallocx,
			    ptr, oldsize, usize, (uintptr_t)ptr,
			    hook_args->args);
			return ptr;
		}
	}

	if (oldsize >= SC_LARGE_MINCLASS
	    && usize >= SC_LARGE_MINCLASS) {
		return large_ralloc(tsdn, arena, ptr, usize,
		    alignment, zero, tcache, hook_args);
	}

	/*
	 * size and oldsize are different enough that we need to move the
	 * object.  In that case, fall back to allocating new space and copying.
	 */
	void *ret = arena_ralloc_move_helper(tsdn, arena, usize, alignment,
	    zero, tcache);
	if (ret == NULL) {
		return NULL;
	}

	hook_invoke_alloc(hook_args->is_realloc
	    ? hook_alloc_realloc : hook_alloc_rallocx, ret, (uintptr_t)ret,
	    hook_args->args);
	hook_invoke_dalloc(hook_args->is_realloc
	    ? hook_dalloc_realloc : hook_dalloc_rallocx, ptr, hook_args->args);

	/*
	 * Junk/zero-filling were already done by
	 * ipalloc()/arena_malloc().
	 */
	size_t copysize = (usize < oldsize) ? usize : oldsize;
	memcpy(ret, ptr, copysize);
	isdalloct(tsdn, ptr, oldsize, tcache, NULL, true);
	return ret;
}